

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O0

bool __thiscall
Diligent::ShaderResourceCacheGL::IsTextureBound
          (ShaderResourceCacheGL *this,Uint32 CacheOffset,bool dbgIsTextureView)

{
  Uint32 UVar1;
  Char *Message;
  IDeviceObject *pIVar2;
  char (*Args_1) [48];
  undefined1 local_48 [8];
  string msg;
  CachedResourceView *Texture;
  bool dbgIsTextureView_local;
  Uint32 CacheOffset_local;
  ShaderResourceCacheGL *this_local;
  
  UVar1 = GetTextureCount(this);
  Args_1 = (char (*) [48])(ulong)UVar1;
  if (CacheOffset < UVar1) {
    msg.field_2._8_8_ = GetConstTexture(this,CacheOffset);
    if ((!dbgIsTextureView) &&
       (((CachedResourceView *)msg.field_2._8_8_)->pTexture != (TextureBaseGL *)0x0)) {
      FormatString<char[26],char[48]>
                ((string *)local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"dbgIsTextureView || Texture.pTexture == nullptr",Args_1);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"IsTextureBound",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
                 ,0x108);
      std::__cxx11::string::~string((string *)local_48);
    }
    pIVar2 = Diligent::RefCntAutoPtr::operator_cast_to_IDeviceObject_
                       ((RefCntAutoPtr *)msg.field_2._8_8_);
    this_local._7_1_ = pIVar2 != (IDeviceObject *)0x0;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool IsTextureBound(Uint32 CacheOffset, bool dbgIsTextureView) const
    {
        if (CacheOffset >= GetTextureCount())
            return false;

        const auto& Texture = GetConstTexture(CacheOffset);
        VERIFY_EXPR(dbgIsTextureView || Texture.pTexture == nullptr);
        return Texture.pView;
    }